

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionCacheThreads_Test::TestBody
          (SSLVersionTest_SessionCacheThreads_Test *this)

{
  bool bVar1;
  pointer psVar2;
  pointer psVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_R9;
  thread *thread_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> *local_578;
  type local_570;
  type local_560;
  type local_558;
  undefined1 local_550 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads_2;
  AssertHelper local_518;
  Message local_510;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__5;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_4a0;
  string local_498;
  AssertHelper local_478;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__4;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_400;
  UniquePtr<SSL_SESSION> expired_session2;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__3;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_360;
  UniquePtr<SSL_SESSION> expired_session1;
  Message local_350;
  undefined1 local_348 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Message local_328;
  size_t local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar;
  thread *thread_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_1;
  SSLVersionTest_SessionCacheThreads_Test *local_2e0;
  pointer *local_2d8;
  int local_2cc;
  undefined1 local_2c8 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads_1;
  size_t limit;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> *local_280;
  type local_278;
  type local_268;
  type local_258;
  type local_248;
  type local_240;
  undefined1 local_238 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_8_1_8991fb9c connect_with_session;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_180;
  UniquePtr<SSL_SESSION> session2;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_d8;
  UniquePtr<SSL_SESSION> session1;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  ClientConfig local_88;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_SessionCacheThreads_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  SSL_CTX_set_options(psVar2,0x4000);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).client_ctx_);
  SSL_CTX_set_session_cache_mode(psVar2,3);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  SSL_CTX_set_session_cache_mode(psVar2,3);
  bVar1 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).client_ctx_);
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).server_ctx_);
    local_88.verify_hostname.field_2._M_allocated_capacity = 0;
    local_88.verify_hostname.field_2._8_8_ = 0;
    local_88.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
    local_88.verify_hostname._1_7_ = 0;
    local_88.verify_hostname._M_string_length = 0;
    local_88.servername.field_2._M_allocated_capacity = 0;
    local_88.servername.field_2._8_8_ = 0;
    local_88.servername._M_dataplus = (_Alloc_hider)0x0;
    local_88.servername._1_7_ = 0;
    local_88.servername._M_string_length = 0;
    local_88.session = (SSL_SESSION *)0x0;
    local_88.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88.hostflags = 0;
    local_88.early_data = false;
    local_88._85_3_ = 0;
    ClientConfig::ClientConfig(&local_88);
    CreateClientSession((anon_unknown_0 *)&local_30,psVar2,psVar3,&local_88);
    local_21 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
    local_21 = !local_21;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_20,&local_21,(type *)0x0);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
    ClientConfig::~ClientConfig(&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
    if (!bVar1) {
      testing::Message::Message(local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_20,
                 (AssertionResult *)"CreateClientSession(client_ctx_.get(), server_ctx_.get())",
                 "true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x199b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      testing::Message::~Message(local_a0);
    }
    session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
    session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
    return;
  }
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).client_ctx_);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__1.message_);
  CreateClientSession((anon_unknown_0 *)&local_d8,psVar2,psVar3,
                      (ClientConfig *)&gtest_ar__1.message_);
  ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_148,&local_d8,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&session2,(internal *)local_148,(AssertionResult *)0x4e0925,"false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x19a2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&session2);
    testing::Message::~Message(&local_150);
  }
  session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
  session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ != 0) goto LAB_0020897c;
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).client_ctx_);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__2.message_);
  CreateClientSession((anon_unknown_0 *)&local_180,psVar2,psVar3,
                      (ClientConfig *)&gtest_ar__2.message_);
  ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_1e8,&local_180,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&connect_with_session,(internal *)local_1e8,(AssertionResult *)0x4e0936,
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x19a5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&connect_with_session);
    testing::Message::~Message(&local_1f0);
  }
  session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
  session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 0) {
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_238);
    local_240.connect_with_session =
         (anon_class_8_1_8991fb9c *)
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__0>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,&local_240);
    local_248.connect_with_session =
         (anon_class_8_1_8991fb9c *)
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__1>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,&local_248);
    local_258.connect_with_session =
         (anon_class_8_1_8991fb9c *)
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    local_258.session1 = &local_d8;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__2>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,&local_258);
    local_268.connect_with_session =
         (anon_class_8_1_8991fb9c *)
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    local_268.session1 = &local_d8;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__3>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,&local_268);
    local_278.connect_with_session =
         (anon_class_8_1_8991fb9c *)
         &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    local_278.session2 = &local_180;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__4>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,&local_278);
    __range2 = (vector<std::thread,_std::allocator<std::thread>_> *)
               &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_280 = &local_180;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__5>
              ((vector<std::thread,std::allocator<std::thread>> *)local_238,(type *)&__range2);
    __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)local_238);
    thread = (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::end
                       ((vector<std::thread,_std::allocator<std::thread>_> *)local_238);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                       *)&thread), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&__end2);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end2);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_238);
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).server_ctx_);
    sVar5 = SSL_CTX_sess_number(psVar2);
    threads_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(sVar5 + 2);
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).server_ctx_);
    SSL_CTX_sess_set_cache_size
              (psVar2,(unsigned_long)
                      threads_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_2c8);
    for (local_2cc = 0; local_2cc < 4; local_2cc = local_2cc + 1) {
      __range2_1 = (vector<std::thread,_std::allocator<std::thread>_> *)
                   &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_2d8 = &threads_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      local_2e0 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__6>
                ((vector<std::thread,std::allocator<std::thread>> *)local_2c8,(type *)&__range2_1);
    }
    __end2_1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_2c8);
    thread_1 = (thread *)
               std::vector<std::thread,_std::allocator<std::thread>_>::end
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_2c8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)&thread_1), bVar1) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
             ::operator*(&__end2_1);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end2_1);
    }
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_SSLVersionTest).server_ctx_);
    local_320 = SSL_CTX_sess_number(psVar2);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_318,"SSL_CTX_sess_number(server_ctx_.get())","limit",&local_320,
               (unsigned_long *)
               &threads_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_fatal_failure_checker.original_reporter_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x19cc,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_fatal_failure_checker.original_reporter_,&local_328);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&gtest_fatal_failure_checker.original_reporter_);
      testing::Message::~Message(&local_328);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_2c8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_348);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                        ((HasNewFatalFailureHelper *)local_348);
      if (bVar1) {
        session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 9;
      }
      else {
        session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 0;
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_348);
      if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 0) {
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        SSL_CTX_set_options(psVar2,0x4000);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_ctx_);
        SSL_CTX_set_session_cache_mode(psVar2,3);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        SSL_CTX_set_session_cache_mode(psVar2,3);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        SSL_CTX_set_current_time_cb(psVar2,CurrentTimeCallback);
        (anonymous_namespace)::g_current_time = 1000;
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_ctx_);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__3.message_);
        CreateClientSession((anon_unknown_0 *)&local_360,psVar2,psVar3,
                            (ClientConfig *)&gtest_ar__3.message_);
        ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__3.message_);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_3c8,&local_360,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
        if (!bVar1) {
          testing::Message::Message(&local_3d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&expired_session2,(internal *)local_3c8,
                     (AssertionResult *)"expired_session1","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_3d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x19da,pcVar4);
          testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
          testing::internal::AssertHelper::~AssertHelper(&local_3d8);
          std::__cxx11::string::~string((string *)&expired_session2);
          testing::Message::~Message(&local_3d0);
        }
        session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
        session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
        if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 0) {
          psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_ctx_);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_ctx_);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__4.message_);
          CreateClientSession((anon_unknown_0 *)&local_400,psVar2,psVar3,
                              (ClientConfig *)&gtest_ar__4.message_);
          ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__4.message_);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_468,&local_400,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
          if (!bVar1) {
            testing::Message::Message(&local_470);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_498,(internal *)local_468,(AssertionResult *)"expired_session2",
                       "false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_478,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x19dd,pcVar4);
            testing::internal::AssertHelper::operator=(&local_478,&local_470);
            testing::internal::AssertHelper::~AssertHelper(&local_478);
            std::__cxx11::string::~string((string *)&local_498);
            testing::Message::~Message(&local_470);
          }
          session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
          session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
          if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 0) {
            (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 720000;
            psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               (&(this->super_SSLVersionTest).client_ctx_);
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               (&(this->super_SSLVersionTest).server_ctx_);
            gtest_ar__5.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__5.message_);
            CreateClientSession((anon_unknown_0 *)&local_4a0,psVar2,psVar3,
                                (ClientConfig *)&gtest_ar__5.message_);
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                      (&local_d8,&local_4a0);
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_4a0);
            ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__5.message_);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_508,&local_d8,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
            if (!bVar1) {
              testing::Message::Message(&local_510);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &threads_2.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_508,
                         (AssertionResult *)0x4e0925,"false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_518,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x19e1,pcVar4);
              testing::internal::AssertHelper::operator=(&local_518,&local_510);
              testing::internal::AssertHelper::~AssertHelper(&local_518);
              std::__cxx11::string::~string
                        ((string *)
                         &threads_2.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_510);
            }
            session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._5_3_ = 0;
            session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
            if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 0) {
              std::vector<std::thread,_std::allocator<std::thread>_>::vector
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_550);
              local_558.connect_with_session =
                   (anon_class_8_1_8991fb9c *)
                   &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
              std::vector<std::thread,std::allocator<std::thread>>::
              emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__7>
                        ((vector<std::thread,std::allocator<std::thread>> *)local_550,&local_558);
              local_560.connect_with_session =
                   (anon_class_8_1_8991fb9c *)
                   &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
              std::vector<std::thread,std::allocator<std::thread>>::
              emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__8>
                        ((vector<std::thread,std::allocator<std::thread>> *)local_550,&local_560);
              local_570.connect_with_session =
                   (anon_class_8_1_8991fb9c *)
                   &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
              local_570.expired_session1 = &local_360;
              std::vector<std::thread,std::allocator<std::thread>>::
              emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__9>
                        ((vector<std::thread,std::allocator<std::thread>> *)local_550,&local_570);
              __range2_2 = (vector<std::thread,_std::allocator<std::thread>_> *)
                           &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_578 = &local_d8;
              std::vector<std::thread,std::allocator<std::thread>>::
              emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__10>
                        ((vector<std::thread,std::allocator<std::thread>> *)local_550,
                         (type *)&__range2_2);
              __end2_2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                                   ((vector<std::thread,_std::allocator<std::thread>_> *)local_550);
              thread_2 = (thread *)
                         std::vector<std::thread,_std::allocator<std::thread>_>::end
                                   ((vector<std::thread,_std::allocator<std::thread>_> *)local_550);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end2_2,
                                        (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                         *)&thread_2), bVar1) {
                __gnu_cxx::
                __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                ::operator*(&__end2_2);
                std::thread::join();
                __gnu_cxx::
                __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                ::operator++(&__end2_2);
              }
              std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_550);
              session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 0;
            }
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_400);
        }
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_360);
      }
      else if (session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ == 9)
      goto LAB_00207f48;
    }
    else {
LAB_00207f48:
      testing::Message::Message(&local_350);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&expired_session1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x19d0,
                 "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&expired_session1,&local_350);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expired_session1);
      testing::Message::~Message(&local_350);
      session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 1;
    }
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_180);
LAB_0020897c:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_d8);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionCacheThreads) {
  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  if (is_tls13()) {
    // Our TLS 1.3 implementation does not support stateful resumption.
    ASSERT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
    return;
  }

  // Establish two client sessions to test with.
  bssl::UniquePtr<SSL_SESSION> session1 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session1);
  bssl::UniquePtr<SSL_SESSION> session2 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session2);

  auto connect_with_session = [&](SSL_SESSION *session) {
    ClientConfig config;
    config.session = session;
    UniquePtr<SSL> client, server;
    ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                       server_ctx_.get(), config));
  };

  // Resume sessions in parallel with establishing new ones.
  {
    std::vector<std::thread> threads;
    threads.emplace_back([&] { connect_with_session(nullptr); });
    threads.emplace_back([&] { connect_with_session(nullptr); });
    threads.emplace_back([&] { connect_with_session(session1.get()); });
    threads.emplace_back([&] { connect_with_session(session1.get()); });
    threads.emplace_back([&] { connect_with_session(session2.get()); });
    threads.emplace_back([&] { connect_with_session(session2.get()); });
    for (auto &thread : threads) {
      thread.join();
    }
  }

  // Hit the maximum session cache size across multiple threads, to test the
  // size enforcement logic.
  size_t limit = SSL_CTX_sess_number(server_ctx_.get()) + 2;
  SSL_CTX_sess_set_cache_size(server_ctx_.get(), limit);
  {
    std::vector<std::thread> threads;
    for (int i = 0; i < 4; i++) {
      threads.emplace_back([&]() {
        connect_with_session(nullptr);
        EXPECT_LE(SSL_CTX_sess_number(server_ctx_.get()), limit);
      });
    }
    for (auto &thread : threads) {
      thread.join();
    }
    EXPECT_EQ(SSL_CTX_sess_number(server_ctx_.get()), limit);
  }

  // Reset the session cache, this time with a mock clock.
  ASSERT_NO_FATAL_FAILURE(ResetContexts());
  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_current_time_cb(server_ctx_.get(), CurrentTimeCallback);

  // Make some sessions at an arbitrary start time. Then expire them.
  g_current_time.tv_sec = 1000;
  bssl::UniquePtr<SSL_SESSION> expired_session1 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(expired_session1);
  bssl::UniquePtr<SSL_SESSION> expired_session2 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(expired_session2);
  g_current_time.tv_sec += 100 * SSL_DEFAULT_SESSION_TIMEOUT;

  session1 = CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session1);

  // Every 256 connections, we flush stale sessions from the session cache. Test
  // this logic is correctly synchronized with other connection attempts.
  static const int kNumConnections = 256;
  {
    std::vector<std::thread> threads;
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(nullptr);
      }
    });
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(nullptr);
      }
    });
    threads.emplace_back([&] {
      // Never connect with |expired_session2|. The session cache eagerly
      // removes expired sessions when it sees them. Leaving |expired_session2|
      // untouched ensures it is instead cleared by periodic flushing.
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(expired_session1.get());
      }
    });
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(session1.get());
      }
    });
    for (auto &thread : threads) {
      thread.join();
    }
  }
}